

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t gt_tval_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int local_28;
  uint64_t offset;
  int timeridx_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  local_28 = 0;
  if ((timeridx == 1) || (timeridx == 4)) {
    uVar1 = gt_virt_cnt_offset(env);
    local_28 = (int)uVar1;
  }
  uVar1 = (env->cp15).c14_timer[timeridx].cval;
  uVar2 = gt_get_countervalue(env);
  return (ulong)(uint)((int)uVar1 - ((int)uVar2 - local_28));
}

Assistant:

static uint64_t gt_tval_read(CPUARMState *env, const ARMCPRegInfo *ri,
                             int timeridx)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    return (uint32_t)(env->cp15.c14_timer[timeridx].cval -
                      (gt_get_countervalue(env) - offset));
}